

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

Value * duckdb::Value::Deserialize(Value *__return_storage_ptr__,Deserializer *deserializer)

{
  double dVar1;
  bool bVar2;
  uchar uVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  LogicalType *pLVar7;
  undefined4 extraout_var;
  unsigned_long uVar8;
  NotImplementedException *this;
  InternalException *this_00;
  char *pcVar9;
  idx_t index;
  float fVar10;
  interval_t iVar11;
  string_t str_00;
  vector<duckdb::Value,_true> children_1;
  LogicalType type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  anon_union_16_2_67f50693_for_value local_80;
  undefined1 local_70 [40];
  LogicalType local_48;
  
  LogicalType::LogicalType(&local_48,INVALID);
  Deserializer::ReadPropertyWithExplicitDefault<duckdb::LogicalType>
            (&type,deserializer,100,"type",&local_48);
  LogicalType::~LogicalType(&local_48);
  if (type.physical_type_ == INVALID) {
    pLVar7 = SerializationData::Get<duckdb::LogicalType_const&>(&deserializer->data);
    LogicalType::operator=(&type,pLVar7);
  }
  bVar2 = Deserializer::ReadProperty<bool>(deserializer,0x65,"is_null");
  LogicalType::LogicalType((LogicalType *)(local_70 + 0x10),&type);
  Value(__return_storage_ptr__,(LogicalType *)(local_70 + 0x10));
  LogicalType::~LogicalType((LogicalType *)(local_70 + 0x10));
  if (bVar2) goto LAB_00292b6e;
  __return_storage_ptr__->is_null = false;
  switch(type.physical_type_) {
  case BOOL:
    uVar3 = Deserializer::ReadProperty<bool>(deserializer,0x66,"value");
    goto LAB_00292f09;
  case UINT8:
    uVar3 = Deserializer::ReadProperty<unsigned_char>(deserializer,0x66,"value");
    goto LAB_00292f09;
  case INT8:
    uVar3 = Deserializer::ReadProperty<signed_char>(deserializer,0x66,"value");
LAB_00292f09:
    (__return_storage_ptr__->value_).tinyint = uVar3;
    break;
  case UINT16:
    uVar4 = Deserializer::ReadProperty<unsigned_short>(deserializer,0x66,"value");
    goto LAB_00292f49;
  case INT16:
    uVar4 = Deserializer::ReadProperty<short>(deserializer,0x66,"value");
LAB_00292f49:
    (__return_storage_ptr__->value_).smallint = uVar4;
    break;
  case UINT32:
    uVar6 = Deserializer::ReadProperty<unsigned_int>(deserializer,0x66,"value");
    goto LAB_00292eb5;
  case INT32:
    uVar6 = Deserializer::ReadProperty<int>(deserializer,0x66,"value");
LAB_00292eb5:
    (__return_storage_ptr__->value_).integer = uVar6;
    break;
  case UINT64:
    uVar8 = Deserializer::ReadProperty<unsigned_long>(deserializer,0x66,"value");
    goto LAB_00292e6a;
  case INT64:
    uVar8 = Deserializer::ReadProperty<long>(deserializer,0x66,"value");
LAB_00292e6a:
    (__return_storage_ptr__->value_).bigint = uVar8;
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
switchD_00292bb3_caseD_a:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&str,"Unimplemented type for Deserialize",(allocator *)&children_1);
    NotImplementedException::NotImplementedException(this,&str);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    fVar10 = Deserializer::ReadProperty<float>(deserializer,0x66,"value");
    (__return_storage_ptr__->value_).float_ = fVar10;
    break;
  case DOUBLE:
    dVar1 = Deserializer::ReadProperty<double>(deserializer,0x66,"value");
    (__return_storage_ptr__->value_).double_ = dVar1;
    break;
  case INTERVAL:
    iVar11 = Deserializer::ReadProperty<duckdb::interval_t>(deserializer,0x66,"value");
    goto LAB_00292f7d;
  case LIST:
    pLVar7 = ListType::GetChildType(&type);
    ::std::
    deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
    ::emplace_back<duckdb::LogicalType_const&>
              ((deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
                *)&(deserializer->data).types,pLVar7);
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    Deserializer::ReadProperty<duckdb::vector<duckdb::Value,true>>
              ((vector<duckdb::Value,_true> *)&str,deserializer,100,"children");
    make_shared_ptr<duckdb::NestedValueInfo,duckdb::vector<duckdb::Value,true>&>(&children_1);
    goto LAB_00292e0e;
  case STRUCT:
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    children_1.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    children_1.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    children_1.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (*deserializer->_vptr_Deserializer[2])(deserializer,100,"children");
    iVar5 = (*deserializer->_vptr_Deserializer[8])(deserializer);
    for (index = 0; CONCAT44(extraout_var,iVar5) != index; index = index + 1) {
      pLVar7 = StructType::GetChildType(&type,index);
      ::std::
      deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
      ::emplace_back<duckdb::LogicalType_const&>
                ((deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
                  *)&(deserializer->data).types,pLVar7);
      Deserializer::Read<duckdb::Value>((type *)&str,deserializer);
      SerializationData::Unset<duckdb::LogicalType>(&deserializer->data);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&children_1,(type *)&str);
      ~Value((type *)&str);
    }
    (*deserializer->_vptr_Deserializer[9])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    make_shared_ptr<duckdb::NestedValueInfo,duckdb::vector<duckdb::Value,true>&>
              ((vector<duckdb::Value,_true> *)&str);
    shared_ptr<duckdb::ExtraValueInfo,_true>::operator=<duckdb::NestedValueInfo,_0>
              (&__return_storage_ptr__->value_info_,
               (shared_ptr<duckdb::NestedValueInfo,_true> *)&str);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&str._M_string_length);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&children_1);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    break;
  case ARRAY:
    pLVar7 = ArrayType::GetChildType(&type);
    ::std::
    deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
    ::emplace_back<duckdb::LogicalType_const&>
              ((deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
                *)&(deserializer->data).types,pLVar7);
    (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"value");
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    Deserializer::ReadProperty<duckdb::vector<duckdb::Value,true>>
              ((vector<duckdb::Value,_true> *)&str,deserializer,100,"children");
    make_shared_ptr<duckdb::NestedValueInfo,duckdb::vector<duckdb::Value,true>&>(&children_1);
LAB_00292e0e:
    shared_ptr<duckdb::ExtraValueInfo,_true>::operator=<duckdb::NestedValueInfo,_0>
              (&__return_storage_ptr__->value_info_,
               (shared_ptr<duckdb::NestedValueInfo,_true> *)&children_1);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &children_1.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_finish);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&str);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
    SerializationData::Unset<duckdb::LogicalType>(&deserializer->data);
    break;
  default:
    switch(type.physical_type_) {
    case VARCHAR:
      pcVar9 = "value";
      Deserializer::ReadProperty<std::__cxx11::string>(&str,deserializer,0x66,"value");
      if (type.id_ == BLOB) {
        string_t::string_t((string_t *)&local_80.pointer,&str);
        str_00.value.pointer.ptr = pcVar9;
        str_00.value._0_8_ = local_80.pointer.ptr;
        Blob::ToBlob_abi_cxx11_((string *)&children_1,(Blob *)local_80._0_8_,str_00);
        make_shared_ptr<duckdb::StringValueInfo,std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
        shared_ptr<duckdb::ExtraValueInfo,_true>::operator=<duckdb::StringValueInfo,_0>
                  (&__return_storage_ptr__->value_info_,
                   (shared_ptr<duckdb::StringValueInfo,_true> *)local_70);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
        ::std::__cxx11::string::~string((string *)&children_1);
      }
      else {
        make_shared_ptr<duckdb::StringValueInfo,std::__cxx11::string&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&children_1)
        ;
        shared_ptr<duckdb::ExtraValueInfo,_true>::operator=<duckdb::StringValueInfo,_0>
                  (&__return_storage_ptr__->value_info_,
                   (shared_ptr<duckdb::StringValueInfo,_true> *)&children_1);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &children_1.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_finish);
      }
      ::std::__cxx11::string::~string((string *)&str);
      goto LAB_00292b6e;
    default:
      goto switchD_00292bb3_caseD_a;
    case UINT128:
      iVar11 = (interval_t)Deserializer::ReadProperty<duckdb::uhugeint_t>(deserializer,0x66,"value")
      ;
      break;
    case INT128:
      iVar11 = (interval_t)Deserializer::ReadProperty<duckdb::hugeint_t>(deserializer,0x66,"value");
      break;
    case BIT:
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&str,"BIT type should not be deserialized",(allocator *)&children_1);
      InternalException::InternalException(this_00,&str);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
LAB_00292f7d:
    (__return_storage_ptr__->value_).interval = iVar11;
  }
LAB_00292b6e:
  LogicalType::~LogicalType(&type);
  return __return_storage_ptr__;
}

Assistant:

Value Value::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadPropertyWithExplicitDefault<LogicalType>(100, "type", LogicalTypeId::INVALID);
	if (type.InternalType() == PhysicalType::INVALID) {
		type = deserializer.Get<const LogicalType &>();
	}
	auto is_null = deserializer.ReadProperty<bool>(101, "is_null");
	Value new_value = Value(type);
	if (is_null) {
		return new_value;
	}
	new_value.is_null = false;
	switch (type.InternalType()) {
	case PhysicalType::BIT:
		throw InternalException("BIT type should not be deserialized");
	case PhysicalType::BOOL:
		new_value.value_.boolean = deserializer.ReadProperty<bool>(102, "value");
		break;
	case PhysicalType::UINT8:
		new_value.value_.utinyint = deserializer.ReadProperty<uint8_t>(102, "value");
		break;
	case PhysicalType::INT8:
		new_value.value_.tinyint = deserializer.ReadProperty<int8_t>(102, "value");
		break;
	case PhysicalType::UINT16:
		new_value.value_.usmallint = deserializer.ReadProperty<uint16_t>(102, "value");
		break;
	case PhysicalType::INT16:
		new_value.value_.smallint = deserializer.ReadProperty<int16_t>(102, "value");
		break;
	case PhysicalType::UINT32:
		new_value.value_.uinteger = deserializer.ReadProperty<uint32_t>(102, "value");
		break;
	case PhysicalType::INT32:
		new_value.value_.integer = deserializer.ReadProperty<int32_t>(102, "value");
		break;
	case PhysicalType::UINT64:
		new_value.value_.ubigint = deserializer.ReadProperty<uint64_t>(102, "value");
		break;
	case PhysicalType::INT64:
		new_value.value_.bigint = deserializer.ReadProperty<int64_t>(102, "value");
		break;
	case PhysicalType::UINT128:
		new_value.value_.uhugeint = deserializer.ReadProperty<uhugeint_t>(102, "value");
		break;
	case PhysicalType::INT128:
		new_value.value_.hugeint = deserializer.ReadProperty<hugeint_t>(102, "value");
		break;
	case PhysicalType::FLOAT:
		new_value.value_.float_ = deserializer.ReadProperty<float>(102, "value");
		break;
	case PhysicalType::DOUBLE:
		new_value.value_.double_ = deserializer.ReadProperty<double>(102, "value");
		break;
	case PhysicalType::INTERVAL:
		new_value.value_.interval = deserializer.ReadProperty<interval_t>(102, "value");
		break;
	case PhysicalType::VARCHAR: {
		auto str = deserializer.ReadProperty<string>(102, "value");
		if (type.id() == LogicalTypeId::BLOB) {
			new_value.value_info_ = make_shared_ptr<StringValueInfo>(Blob::ToBlob(str));
		} else {
			new_value.value_info_ = make_shared_ptr<StringValueInfo>(str);
		}
	} break;
	case PhysicalType::LIST: {
		deserializer.Set<const LogicalType &>(ListType::GetChildType(type));
		deserializer.ReadObject(102, "value", [&](Deserializer &obj) {
			auto children = obj.ReadProperty<vector<Value>>(100, "children");
			new_value.value_info_ = make_shared_ptr<NestedValueInfo>(children);
		});
		deserializer.Unset<LogicalType>();
	} break;
	case PhysicalType::STRUCT: {
		deserializer.ReadObject(102, "value", [&](Deserializer &obj) {
			vector<Value> children;
			obj.ReadList(100, "children", [&](Deserializer::List &list, idx_t i) {
				deserializer.Set<const LogicalType &>(StructType::GetChildType(type, i));
				auto child = list.ReadElement<Value>();
				deserializer.Unset<LogicalType>();
				children.push_back(std::move(child));
			});
			new_value.value_info_ = make_shared_ptr<NestedValueInfo>(children);
		});
	} break;
	case PhysicalType::ARRAY: {
		deserializer.Set<const LogicalType &>(ArrayType::GetChildType(type));
		deserializer.ReadObject(102, "value", [&](Deserializer &obj) {
			auto children = obj.ReadProperty<vector<Value>>(100, "children");
			new_value.value_info_ = make_shared_ptr<NestedValueInfo>(children);
		});
		deserializer.Unset<LogicalType>();
	} break;
	default:
		throw NotImplementedException("Unimplemented type for Deserialize");
	}
	return new_value;
}